

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transpose.h
# Opt level: O3

void Eigen::internal::
     check_for_aliasing<Eigen::Matrix<double,_1,_1,0,_1,_1>,Eigen::Transpose<Eigen::Matrix<double,_1,_1,0,_1,_1>>>
               (Matrix<double,__1,__1,_0,__1,__1> *dst,
               Transpose<Eigen::Matrix<double,__1,__1,_0,__1,__1>_> *src)

{
  double *pdVar1;
  
  if ((((1 < (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
             m_rows) &&
       (1 < (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.m_cols
       )) && (pdVar1 = (dst->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).
                       m_storage.m_data, pdVar1 != (double *)0x0)) &&
     ((src->m_matrix->super_PlainObjectBase<Eigen::Matrix<double,__1,__1,_0,__1,__1>_>).m_storage.
      m_data == pdVar1)) {
    __assert_fail("(!check_transpose_aliasing_run_time_selector <typename Derived::Scalar,blas_traits<Derived>::IsTransposed,OtherDerived> ::run(extract_data(dst), other)) && \"aliasing detected during transposition, use transposeInPlace() \" \"or evaluate the rhs into a temporary using .eval()\""
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/usnistgov[P]ChebTools/externals/Eigen/Eigen/src/Core/Transpose.h"
                  ,0x1b6,
                  "static void Eigen::internal::checkTransposeAliasing_impl<Eigen::Matrix<double, -1, -1>, Eigen::Transpose<Eigen::Matrix<double, -1, -1>>>::run(const Derived &, const OtherDerived &) [Derived = Eigen::Matrix<double, -1, -1>, OtherDerived = Eigen::Transpose<Eigen::Matrix<double, -1, -1>>, MightHaveTransposeAliasing = true]"
                 );
  }
  return;
}

Assistant:

void check_for_aliasing(const Dst &dst, const Src &src)
{
  if((!Dst::IsVectorAtCompileTime) && dst.rows()>1 && dst.cols()>1)
    internal::checkTransposeAliasing_impl<Dst, Src>::run(dst, src);
}